

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int mtar_open(mtar_t *tar,char *filename,char *mode)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *pFVar4;
  int iVar5;
  char *pcVar6;
  mtar_header_t h;
  mtar_header_t local_110;
  
  pcVar2 = strchr(mode,0x72);
  pcVar6 = "rb";
  if (pcVar2 == (char *)0x0) {
    pcVar6 = mode;
  }
  pcVar3 = strchr(pcVar6,0x77);
  pcVar2 = "wb";
  if (pcVar3 == (char *)0x0) {
    pcVar2 = pcVar6;
  }
  pcVar3 = strchr(pcVar2,0x61);
  pcVar6 = "ab";
  if (pcVar3 == (char *)0x0) {
    pcVar6 = pcVar2;
  }
  pFVar4 = fopen(filename,pcVar6);
  if (pFVar4 == (FILE *)0x0) {
    iVar5 = -2;
  }
  else {
    tar->read = (mtar_read_t)0x0;
    tar->write = (mtar_write_t)0x0;
    tar->seek = (mtar_seek_t)0x0;
    tar->close = (mtar_close_t)0x0;
    tar->stream = (void *)0x0;
    tar->pos = 0;
    tar->memory_size = 0;
    tar->memory_capacity = 0;
    tar->memory = (void *)0x0;
    tar->memory_pos = 0;
    tar->remaining_data = 0;
    tar->last_header = 0;
    tar->write = mtar_file_write;
    tar->read = mtar_file_read;
    tar->seek = mtar_file_seek;
    tar->close = mtar_file_close;
    tar->stream = pFVar4;
    iVar5 = 0;
    if (((*pcVar6 == 'r') && (iVar1 = mtar_read_header(tar,&local_110), iVar5 = 0, iVar1 != 0)) &&
       (iVar5 = iVar1, tar->close != (mtar_close_t)0x0)) {
      (*tar->close)(tar);
    }
  }
  return iVar5;
}

Assistant:

int mtar_open(mtar_t *tar, const char *filename, const char *mode) {
  FILE *fp;
  int err;
  mtar_header_t h;

  /* Assure mode is always binary */
  if ( strchr(mode, 'r') ) mode = "rb";
  if ( strchr(mode, 'w') ) mode = "wb";
  if ( strchr(mode, 'a') ) mode = "ab";

  /* Open file */
  fp = fopen(filename, mode);
  if (!fp) {
    return MTAR_EOPENFAIL;
  }

  err = mtar_open_fp(tar, fp);
  if (err) {
    return err;
  }

  /* Read first header to check it is valid if mode is `r` */
  if (*mode == 'r') {
    err = mtar_read_header(tar, &h);
    if (err != MTAR_ESUCCESS) {
      mtar_close(tar);
      return err;
    }
  }

  /* Return ok */
  return MTAR_ESUCCESS;
}